

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

void __thiscall QSettings::endGroup(QSettings *this)

{
  QObjectData *pQVar1;
  ulong uVar2;
  __off_t __length;
  long in_FS_OFFSET;
  QMessageLogger local_68;
  value_type local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[2].children.d.ptr == (QObject **)0x0) {
    local_48.str.d.d._0_4_ = 2;
    local_48.str.d.size._4_4_ = 0;
    local_48.str.d.d._4_4_ = 0;
    local_48.str.d.ptr._0_4_ = 0;
    local_48.str.d.ptr._4_4_ = 0;
    local_48.str.d.size._0_4_ = 0;
    local_48.num = 0x455595;
    QMessageLogger::warning
              ((QMessageLogger *)&local_48,"QSettings::endGroup: No matching beginGroup()");
  }
  else {
    local_48.maxNum = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.str.d.size._0_4_ = 0xaaaaaaaa;
    local_48.str.d.size._4_4_ = 0xaaaaaaaa;
    local_48.num = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.str.d.d._0_4_ = 0xaaaaaaaa;
    local_48.str.d.d._4_4_ = 0xaaaaaaaa;
    local_48.str.d.ptr._0_4_ = 0xaaaaaaaa;
    local_48.str.d.ptr._4_4_ = 0xaaaaaaaa;
    QList<QSettingsGroup>::takeLast(&local_48,(QList<QSettingsGroup> *)&pQVar1[2].parent);
    QSettingsGroup::toString((QString *)&local_68,&local_48);
    uVar2 = CONCAT44(local_68.context.function._4_4_,local_68.context.function._0_4_);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (uVar2 != 0) {
      QString::truncate((QString *)&pQVar1[2].children.d.size,
                        (char *)((long)&(pQVar1[2].metaObject)->_vptr_QDynamicMetaObjectData +
                                ~uVar2),__length);
    }
    if ((char *)local_48.num != (char *)0xffffffffffffffff) {
      local_68.context.version = 2;
      local_68.context.function._4_4_ = 0;
      local_68.context._4_8_ = 0;
      local_68.context.file._4_4_ = 0;
      local_68.context.function._0_4_ = 0;
      local_68.context.category = "default";
      QMessageLogger::warning(&local_68,"QSettings::endGroup: Expected endArray() instead");
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::endGroup()
{
    Q_D(QSettings);
    if (d->groupStack.isEmpty()) {
        qWarning("QSettings::endGroup: No matching beginGroup()");
        return;
    }

    QSettingsGroup group = d->groupStack.pop();
    qsizetype len = group.toString().size();
    if (len > 0)
        d->groupPrefix.truncate(d->groupPrefix.size() - (len + 1));

    if (group.isArray())
        qWarning("QSettings::endGroup: Expected endArray() instead");
}